

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtmem.cpp
# Opt level: O0

Error asmjit::v1_14::VirtMem::protect(void *p,size_t size,MemoryFlags memoryFlags)

{
  int iVar1;
  Error err;
  int *piVar2;
  size_t in_RSI;
  void *in_RDI;
  int protection;
  undefined4 local_4;
  
  iVar1 = mmProtFromMemoryFlags(kNone);
  iVar1 = mprotect(in_RDI,in_RSI,iVar1);
  if (iVar1 == 0) {
    local_4 = 0;
  }
  else {
    piVar2 = __errno_location();
    err = asmjitErrorFromErrno(*piVar2);
    local_4 = DebugUtils::errored(err);
  }
  return local_4;
}

Assistant:

Error protect(void* p, size_t size, MemoryFlags memoryFlags) noexcept {
  int protection = mmProtFromMemoryFlags(memoryFlags);
  if (mprotect(p, size, protection) == 0)
    return kErrorOk;

  return DebugUtils::errored(asmjitErrorFromErrno(errno));
}